

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O1

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::handleExtremes(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *lp)

{
  Item *this_00;
  undefined8 *puVar1;
  uint *puVar2;
  fpclass_type fVar3;
  int32_t iVar4;
  uint uVar5;
  pointer pnVar6;
  Tolerances *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  Item *pIVar7;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar8;
  char cVar9;
  undefined8 uVar10;
  FreeConstraintPS **ppFVar11;
  __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  _Var12;
  element_type *peVar13;
  undefined1 auVar14 [16];
  bool bVar15;
  int iVar16;
  int iVar17;
  bool *pbVar18;
  FreeConstraintPS **ppFVar19;
  int *piVar20;
  char *pcVar21;
  long lVar22;
  SPxOut *pSVar23;
  int iVar24;
  ulong uVar25;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *r;
  char *__filename;
  ostream *os;
  cpp_dec_float<50U,_int,_void> *pcVar26;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar27;
  uint uVar28;
  int iVar29;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar30;
  long lVar31;
  long in_FS_OFFSET;
  FreeConstraintPS *pFVar32;
  Real eps;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxVal;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  aij;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_6;
  undefined1 local_668 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_660;
  uint local_658 [3];
  undefined3 uStack_64b;
  uint local_648;
  undefined3 uStack_643;
  int local_640;
  bool local_63c;
  FreeConstraintPS *local_638;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_630;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_628;
  ulong local_620;
  ulong local_618;
  int local_60c;
  element_type *local_608;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_600;
  uint local_5f8 [2];
  uint auStack_5f0 [2];
  uint local_5e8 [2];
  int local_5e0;
  bool local_5dc [4];
  FreeConstraintPS *local_5d8 [2];
  element_type *local_5c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_5c0;
  uint local_5b8 [2];
  uint auStack_5b0 [2];
  uint local_5a8 [2];
  int local_5a0;
  bool local_59c [4];
  FreeConstraintPS *local_598;
  undefined4 local_58c;
  undefined1 local_588 [16];
  uint local_578 [3];
  undefined3 uStack_56b;
  uint local_568 [3];
  bool local_55c;
  undefined8 local_558;
  FreeConstraintPS *local_548;
  ulong uStack_540;
  FreeConstraintPS *local_538;
  ulong uStack_530;
  element_type *local_528;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_520;
  uint local_518 [3];
  undefined3 uStack_50b;
  uint local_508;
  undefined3 uStack_503;
  int local_500;
  bool local_4fc;
  FreeConstraintPS *local_4f8;
  element_type *local_4e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_4e0;
  uint local_4d8 [2];
  uint auStack_4d0 [2];
  uint local_4c8 [2];
  int local_4c0;
  bool local_4bc;
  undefined8 local_4b8;
  FreeConstraintPS *local_4a8;
  ulong uStack_4a0;
  ulong local_490;
  FreeConstraintPS *local_488;
  undefined8 uStack_480;
  undefined1 local_478 [8];
  undefined8 uStack_470;
  uint local_468 [3];
  undefined3 uStack_45b;
  uint local_458;
  undefined3 uStack_453;
  int local_450;
  bool local_44c;
  FreeConstraintPS *local_448;
  shared_ptr<soplex::Tolerances> local_438;
  element_type *local_428;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_420;
  uint local_418 [2];
  uint auStack_410 [2];
  uint local_408 [2];
  int local_400;
  bool local_3fc;
  undefined8 local_3f8;
  element_type *local_3e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_3e0;
  uint local_3d8 [2];
  uint auStack_3d0 [2];
  uint local_3c8 [4];
  element_type *local_3b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_3b0;
  uint local_3a8 [2];
  undefined8 uStack_3a0;
  uint local_398 [4];
  element_type *local_388;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_380;
  uint local_378 [2];
  uint auStack_370 [2];
  uint local_368 [4];
  element_type *local_358;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_350;
  uint local_348 [2];
  uint auStack_340 [2];
  uint local_338 [4];
  element_type *local_328;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_320;
  uint local_318 [2];
  uint auStack_310 [2];
  uint local_308 [4];
  element_type *local_2f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_2f0;
  uint local_2e8 [2];
  uint auStack_2e0 [2];
  uint local_2d8 [4];
  element_type *local_2c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_2c0;
  uint local_2b8 [2];
  uint auStack_2b0 [2];
  uint local_2a8 [2];
  int local_2a0;
  bool local_29c;
  FreeConstraintPS *local_298;
  element_type *local_288;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_280;
  uint local_278 [2];
  uint auStack_270 [2];
  uint local_268 [2];
  int local_260;
  bool local_25c;
  FreeConstraintPS *local_258;
  element_type *local_248;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_240;
  uint local_238 [2];
  uint auStack_230 [2];
  uint local_228 [2];
  int local_220;
  bool local_21c;
  FreeConstraintPS *local_218;
  element_type *local_208;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_200;
  uint local_1f8 [2];
  uint auStack_1f0 [2];
  uint local_1e8 [2];
  int local_1e0;
  bool local_1dc;
  FreeConstraintPS *local_1d8;
  element_type *local_1c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1c0;
  uint local_1b8 [2];
  uint auStack_1b0 [2];
  uint local_1a8 [2];
  int local_1a0;
  bool local_19c;
  FreeConstraintPS *local_198;
  element_type *local_188;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_180;
  uint local_178 [2];
  uint auStack_170 [2];
  uint local_168 [2];
  int local_160;
  bool local_15c;
  FreeConstraintPS *local_158;
  cpp_dec_float<50U,_int,_void> local_148;
  cpp_dec_float<50U,_int,_void> local_110;
  cpp_dec_float<50U,_int,_void> local_d8;
  cpp_dec_float<50U,_int,_void> local_a0;
  cpp_dec_float<50U,_int,_void> local_68;
  
  local_630 = lp;
  local_628 = this;
  ::soplex::infinity::__tls_init();
  local_538 = *(FreeConstraintPS **)(in_FS_OFFSET + -8);
  local_448 = (FreeConstraintPS *)0xa00000000;
  local_478._0_4_ = 0;
  local_478._4_4_ = 0;
  uStack_470._0_4_ = 0;
  uStack_470._4_4_ = 0;
  local_468[0] = 0;
  local_468[1] = 0;
  stack0xfffffffffffffba0 = 0;
  uStack_45b = 0;
  _local_458 = 0;
  uStack_453 = 0;
  local_450 = 0;
  local_44c = false;
  uStack_530 = 0;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)local_478,(double)local_538);
  local_4f8 = (FreeConstraintPS *)0xa00000000;
  local_528 = (element_type *)0x0;
  p_Stack_520 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_518[0] = 0;
  local_518[1] = 0;
  stack0xfffffffffffffaf0 = 0;
  uStack_50b = 0;
  _local_508 = 0;
  uStack_503 = 0;
  local_500 = 0;
  local_4fc = false;
  local_638 = (FreeConstraintPS *)0xa00000000;
  _local_668 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                )ZEXT816(0);
  local_658[0] = 0;
  local_658[1] = 0;
  stack0xfffffffffffff9b0 = 0;
  uStack_64b = 0;
  _local_648 = 0;
  uStack_643 = 0;
  local_640 = 0;
  local_63c = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)local_668,5.0);
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            ((cpp_dec_float<50U,_int,_void> *)&local_528,(cpp_dec_float<50U,_int,_void> *)local_478,
             (cpp_dec_float<50U,_int,_void> *)local_668);
  pSVar30 = local_628;
  feastol((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&local_5c8,local_628);
  local_448 = (FreeConstraintPS *)0xa00000000;
  local_478._0_4_ = 0;
  local_478._4_4_ = 0;
  uStack_470._0_4_ = 0;
  uStack_470._4_4_ = 0;
  local_468[0] = 0;
  local_468[1] = 0;
  stack0xfffffffffffffba0 = 0;
  uStack_45b = 0;
  _local_458 = 0;
  uStack_453 = 0;
  local_450 = 0;
  local_44c = false;
  local_638 = (FreeConstraintPS *)0xa00000000;
  _local_668 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                )ZEXT816(0);
  local_658[0] = 0;
  local_658[1] = 0;
  stack0xfffffffffffff9b0 = 0;
  uStack_64b = 0;
  _local_648 = 0;
  uStack_643 = 0;
  local_640 = 0;
  local_63c = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)local_668,0.01);
  local_478 = (undefined1  [8])local_5c8;
  uStack_470 = p_Stack_5c0;
  local_468[0] = local_5b8[0];
  local_468[1] = local_5b8[1];
  stack0xfffffffffffffba0 = auStack_5b0._0_5_;
  uStack_45b = auStack_5b0[1]._1_3_;
  _local_458 = local_5a8._0_5_;
  uStack_453 = local_5a8[1]._1_3_;
  local_450 = local_5a0;
  local_44c = local_59c[0];
  local_448 = local_598;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
            ((cpp_dec_float<50U,_int,_void> *)local_478,(cpp_dec_float<50U,_int,_void> *)local_668);
  epsZero((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&local_5c8,pSVar30);
  if ((((fpclass_type)local_448 == cpp_dec_float_NaN) ||
      ((fpclass_type)local_598 == cpp_dec_float_NaN)) ||
     (iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         ((cpp_dec_float<50U,_int,_void> *)local_478,
                          (cpp_dec_float<50U,_int,_void> *)&local_5c8), -1 < iVar16)) {
    _local_648 = _local_458;
    uStack_643 = uStack_453;
    local_658[0] = local_468[0];
    local_658[1] = local_468[1];
    stack0xfffffffffffff9b0 = stack0xfffffffffffffba0;
    uStack_64b = uStack_45b;
    _Stack_660._M_pi = uStack_470;
    local_668 = local_478;
    local_640 = local_450;
    local_63c = local_44c;
    local_638 = local_448;
  }
  else {
    epsZero((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *)local_668,local_628);
  }
  _local_458 = _local_648;
  uStack_453 = uStack_643;
  local_468[0] = local_658[0];
  local_468[1] = local_658[1];
  stack0xfffffffffffffba0 = stack0xfffffffffffff9b0;
  uStack_45b = uStack_64b;
  local_478 = local_668;
  uStack_470 = _Stack_660._M_pi;
  local_450 = local_640;
  local_44c = local_63c;
  local_448 = local_638;
  lVar31 = (long)(local_630->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum;
  local_60c = 0;
  local_618 = 0;
  local_490 = 0;
  pSVar27 = local_630;
  if (0 < lVar31) {
    local_4a8 = (FreeConstraintPS *)((ulong)local_538 ^ 0x8000000000000000);
    uStack_4a0 = uStack_530 ^ 0x8000000000000000;
    local_488 = (FreeConstraintPS *)&local_628->m_hist;
    lVar22 = lVar31 * 0x38;
    local_490 = 0;
    local_618 = 0;
    do {
      pnVar6 = (pSVar27->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).left.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_5a8 = *(uint (*) [2])((long)(pnVar6->m_backend).data._M_elems + lVar22 + -0x18);
      puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22);
      local_5c8 = (element_type *)*puVar1;
      p_Stack_5c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar1[1];
      puVar2 = (uint *)((long)(&(pnVar6->m_backend).data + -1) + lVar22);
      local_5b8 = *(uint (*) [2])puVar2;
      auStack_5b0 = *(uint (*) [2])(puVar2 + 2);
      local_5a0 = *(int *)((long)(pnVar6->m_backend).data._M_elems + lVar22 + -0x10);
      local_59c[0] = *(bool *)((long)(pnVar6->m_backend).data._M_elems + lVar22 + -0xc);
      local_598 = *(FreeConstraintPS **)((long)(pnVar6->m_backend).data._M_elems + lVar22 + -8);
      iVar16 = (int)lVar31;
      if ((int)local_598 == 2) {
LAB_002d538f:
        pFVar32 = local_598;
        bVar15 = local_59c[0];
        iVar17 = local_5a0;
        local_2d8[0] = local_5a8[0];
        local_2d8[1] = local_5a8[1];
        local_2e8[0] = local_5b8[0];
        local_2e8[1] = local_5b8[1];
        auStack_2e0[0] = auStack_5b0[0];
        auStack_2e0[1] = auStack_5b0[1];
        local_2f8 = local_5c8;
        _Stack_2f0._M_pi = p_Stack_5c0;
        local_548 = local_598;
        uStack_540 = 0;
        epsZero((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)&local_68,local_628);
        _local_648 = (undefined5)local_2d8._0_8_;
        uStack_643 = SUB83(local_2d8._0_8_,5);
        local_658[0] = local_2e8[0];
        local_658[1] = local_2e8[1];
        stack0xfffffffffffff9b0 = auStack_2e0._0_5_;
        uStack_64b = auStack_2e0[1]._1_3_;
        _Stack_660._M_pi = _Stack_2f0._M_pi;
        local_668 = (undefined1  [8])local_2f8;
        _Var12 = _local_668;
        local_640 = iVar17;
        local_63c = bVar15;
        local_638 = pFVar32;
        if ((bVar15 == true) &&
           (local_668._0_4_ = SUB84(local_2f8,0), local_668._0_4_ != 0 || (int)local_548 != 0)) {
          local_63c = false;
        }
        pSVar27 = local_630;
        _local_668 = _Var12;
        if ((((int)local_548 == 2) || (local_68.fpclass == cpp_dec_float_NaN)) ||
           (iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)local_668,&local_68),
           pSVar27 = local_630, 0 < iVar17)) goto LAB_002d54d8;
        local_668 = (undefined1  [8])0x0;
        _Stack_660._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        pFVar32 = (FreeConstraintPS *)0x0;
LAB_002d56ef:
        local_63c = false;
        local_640 = 0;
        uStack_643 = 0;
        _local_648 = 0;
        uStack_64b = 0;
        stack0xfffffffffffff9b0 = 0;
        local_658[0] = 0;
        local_658[1] = 0;
        local_638 = (FreeConstraintPS *)0xa00000000;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)local_668,(double)pFVar32);
        (*(pSVar27->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x33])(pSVar27,(ulong)(iVar16 - 1),local_668,0);
        local_618 = (ulong)((int)local_618 + 1);
      }
      else {
        local_638 = (FreeConstraintPS *)0xa00000000;
        local_668 = (undefined1  [8])0x0;
        _Stack_660._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_658[0] = 0;
        local_658[1] = 0;
        stack0xfffffffffffff9b0 = 0;
        uStack_64b = 0;
        _local_648 = 0;
        uStack_643 = 0;
        local_640 = 0;
        local_63c = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)local_668,0.0);
        iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           ((cpp_dec_float<50U,_int,_void> *)&local_5c8,
                            (cpp_dec_float<50U,_int,_void> *)local_668);
        if (iVar17 != 0) goto LAB_002d538f;
LAB_002d54d8:
        ::soplex::infinity::__tls_init();
        local_638 = (FreeConstraintPS *)0xa00000000;
        local_668 = (undefined1  [8])0x0;
        _Stack_660._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_658[0] = 0;
        local_658[1] = 0;
        stack0xfffffffffffff9b0 = 0;
        uStack_64b = 0;
        _local_648 = 0;
        uStack_643 = 0;
        local_640 = 0;
        local_63c = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)local_668,(double)local_4a8);
        if ((((fpclass_type)local_598 != cpp_dec_float_NaN) &&
            ((fpclass_type)local_638 != cpp_dec_float_NaN)) &&
           (iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)&local_5c8,
                                (cpp_dec_float<50U,_int,_void> *)local_668), 0 < iVar17)) {
          auStack_5f0[1]._1_3_ = uStack_50b;
          auStack_5f0._0_5_ = stack0xfffffffffffffaf0;
          local_608 = local_528;
          peVar13 = local_608;
          p_Stack_600 = p_Stack_520;
          local_5e8[1]._1_3_ = uStack_503;
          local_5e8._0_5_ = _local_508;
          local_5f8[0] = local_518[0];
          local_5f8[1] = local_518[1];
          local_5e0 = local_500;
          local_5dc[0] = local_4fc;
          local_5d8[0] = local_4f8;
          local_608._0_4_ = (uint)local_528;
          if ((uint)local_608 != 0 || (int)local_4f8 != 0) {
            local_5dc[0] = (bool)(local_4fc ^ 1);
          }
          local_608 = peVar13;
          if ((((int)local_4f8 != 2) && ((fpclass_type)local_598 != cpp_dec_float_NaN)) &&
             (iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 ((cpp_dec_float<50U,_int,_void> *)&local_5c8,
                                  (cpp_dec_float<50U,_int,_void> *)&local_608), iVar17 < 0)) {
            ::soplex::infinity::__tls_init();
            _local_668 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                          )ZEXT816(0);
            pFVar32 = local_4a8;
            goto LAB_002d56ef;
          }
        }
        ::soplex::infinity::__tls_init();
        local_638 = (FreeConstraintPS *)0xa00000000;
        _local_668 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                      )ZEXT816(0);
        local_658[0] = 0;
        local_658[1] = 0;
        stack0xfffffffffffff9b0 = 0;
        uStack_64b = 0;
        _local_648 = 0;
        uStack_643 = 0;
        local_640 = 0;
        local_63c = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)local_668,(double)local_538);
        if ((((fpclass_type)local_598 != cpp_dec_float_NaN) &&
            ((fpclass_type)local_638 != cpp_dec_float_NaN)) &&
           ((iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                ((cpp_dec_float<50U,_int,_void> *)&local_5c8,
                                 (cpp_dec_float<50U,_int,_void> *)local_668), iVar17 < 0 &&
            ((((fpclass_type)local_598 != cpp_dec_float_NaN &&
              ((fpclass_type)local_4f8 != cpp_dec_float_NaN)) &&
             (iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 ((cpp_dec_float<50U,_int,_void> *)&local_5c8,
                                  (cpp_dec_float<50U,_int,_void> *)&local_528), 0 < iVar17)))))) {
          ::soplex::infinity::__tls_init();
          local_668 = (undefined1  [8])0x0;
          _Stack_660._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          pFVar32 = local_538;
          goto LAB_002d56ef;
        }
      }
      pnVar6 = (pSVar27->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).right.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_5e8 = *(uint (*) [2])((long)(pnVar6->m_backend).data._M_elems + lVar22 + -0x18);
      puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22);
      local_608 = (element_type *)*puVar1;
      p_Stack_600 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar1[1];
      puVar2 = (uint *)((long)(&(pnVar6->m_backend).data + -1) + lVar22);
      local_5f8 = *(uint (*) [2])puVar2;
      auStack_5f0 = *(uint (*) [2])(puVar2 + 2);
      local_5e0 = *(int *)((long)(pnVar6->m_backend).data._M_elems + lVar22 + -0x10);
      local_5dc[0] = *(bool *)((long)(pnVar6->m_backend).data._M_elems + lVar22 + -0xc);
      local_5d8[0] = *(FreeConstraintPS **)((long)(pnVar6->m_backend).data._M_elems + lVar22 + -8);
      if ((int)local_5d8[0] == 2) {
LAB_002d57ae:
        pFVar32 = local_5d8[0];
        bVar15 = local_5dc[0];
        iVar17 = local_5e0;
        local_308[0] = local_5e8[0];
        local_308[1] = local_5e8[1];
        local_318[0] = local_5f8[0];
        local_318[1] = local_5f8[1];
        auStack_310[0] = auStack_5f0[0];
        auStack_310[1] = auStack_5f0[1];
        local_328 = local_608;
        _Stack_320._M_pi = p_Stack_600;
        local_548 = local_5d8[0];
        uStack_540 = 0;
        epsZero((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)&local_a0,local_628);
        _local_648 = (undefined5)local_308._0_8_;
        uStack_643 = SUB83(local_308._0_8_,5);
        local_658[0] = local_318[0];
        local_658[1] = local_318[1];
        stack0xfffffffffffff9b0 = auStack_310._0_5_;
        uStack_64b = auStack_310[1]._1_3_;
        _Stack_660._M_pi = _Stack_320._M_pi;
        local_668 = (undefined1  [8])local_328;
        _Var12 = _local_668;
        local_640 = iVar17;
        local_63c = bVar15;
        local_638 = pFVar32;
        if ((bVar15 == true) &&
           (local_668._0_4_ = SUB84(local_328,0), local_668._0_4_ != 0 || (int)local_548 != 0)) {
          local_63c = false;
        }
        pSVar27 = local_630;
        _local_668 = _Var12;
        if ((((int)local_548 == 2) || (local_a0.fpclass == cpp_dec_float_NaN)) ||
           (iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)local_668,&local_a0),
           pSVar27 = local_630, 0 < iVar17)) goto LAB_002d58ef;
        local_668 = (undefined1  [8])0x0;
        _Stack_660._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        pFVar32 = (FreeConstraintPS *)0x0;
LAB_002d5b06:
        local_63c = false;
        local_640 = 0;
        uStack_643 = 0;
        _local_648 = 0;
        uStack_64b = 0;
        stack0xfffffffffffff9b0 = 0;
        local_658[0] = 0;
        local_658[1] = 0;
        local_638 = (FreeConstraintPS *)0xa00000000;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)local_668,(double)pFVar32);
        (*(pSVar27->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x36])(pSVar27,(ulong)(iVar16 - 1),local_668,0);
        local_618 = (ulong)((int)local_618 + 1);
      }
      else {
        local_638 = (FreeConstraintPS *)0xa00000000;
        local_668 = (undefined1  [8])0x0;
        _Stack_660._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_658[0] = 0;
        local_658[1] = 0;
        stack0xfffffffffffff9b0 = 0;
        uStack_64b = 0;
        _local_648 = 0;
        uStack_643 = 0;
        local_640 = 0;
        local_63c = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)local_668,0.0);
        iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           ((cpp_dec_float<50U,_int,_void> *)&local_608,
                            (cpp_dec_float<50U,_int,_void> *)local_668);
        if (iVar17 != 0) goto LAB_002d57ae;
LAB_002d58ef:
        ::soplex::infinity::__tls_init();
        local_638 = (FreeConstraintPS *)0xa00000000;
        local_668 = (undefined1  [8])0x0;
        _Stack_660._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_658[0] = 0;
        local_658[1] = 0;
        stack0xfffffffffffff9b0 = 0;
        uStack_64b = 0;
        _local_648 = 0;
        uStack_643 = 0;
        local_640 = 0;
        local_63c = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)local_668,(double)local_4a8);
        if ((((fpclass_type)local_5d8[0] != cpp_dec_float_NaN) &&
            ((fpclass_type)local_638 != cpp_dec_float_NaN)) &&
           (iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)&local_608,
                                (cpp_dec_float<50U,_int,_void> *)local_668), 0 < iVar17)) {
          local_588._8_8_ = p_Stack_520;
          local_588._0_8_ = local_528;
          auVar14 = local_588;
          local_568[1]._1_3_ = uStack_503;
          local_568._0_5_ = _local_508;
          local_578[0] = local_518[0];
          local_578[1] = local_518[1];
          stack0xfffffffffffffa90 = stack0xfffffffffffffaf0;
          uStack_56b = uStack_50b;
          local_568[2] = local_500;
          local_55c = local_4fc;
          local_558 = local_4f8;
          local_588._0_4_ = SUB84(local_528,0);
          if (local_588._0_4_ != 0 || (int)local_4f8 != 0) {
            local_55c = (bool)(local_4fc ^ 1);
          }
          local_588 = auVar14;
          if ((((int)local_4f8 != 2) && ((fpclass_type)local_5d8[0] != cpp_dec_float_NaN)) &&
             (iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 ((cpp_dec_float<50U,_int,_void> *)&local_608,
                                  (cpp_dec_float<50U,_int,_void> *)local_588), iVar17 < 0)) {
            ::soplex::infinity::__tls_init();
            _local_668 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                          )ZEXT816(0);
            pFVar32 = local_4a8;
            goto LAB_002d5b06;
          }
        }
        ::soplex::infinity::__tls_init();
        local_638 = (FreeConstraintPS *)0xa00000000;
        _local_668 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                      )ZEXT816(0);
        local_658[0] = 0;
        local_658[1] = 0;
        stack0xfffffffffffff9b0 = 0;
        uStack_64b = 0;
        _local_648 = 0;
        uStack_643 = 0;
        local_640 = 0;
        local_63c = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)local_668,(double)local_538);
        if ((((fpclass_type)local_5d8[0] != cpp_dec_float_NaN) &&
            ((fpclass_type)local_638 != cpp_dec_float_NaN)) &&
           ((iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                ((cpp_dec_float<50U,_int,_void> *)&local_608,
                                 (cpp_dec_float<50U,_int,_void> *)local_668), iVar17 < 0 &&
            ((((fpclass_type)local_5d8[0] != cpp_dec_float_NaN &&
              ((fpclass_type)local_4f8 != cpp_dec_float_NaN)) &&
             (iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 ((cpp_dec_float<50U,_int,_void> *)&local_608,
                                  (cpp_dec_float<50U,_int,_void> *)&local_528), 0 < iVar17)))))) {
          ::soplex::infinity::__tls_init();
          local_668 = (undefined1  [8])0x0;
          _Stack_660._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          pFVar32 = local_538;
          goto LAB_002d5b06;
        }
      }
      pnVar6 = (pSVar27->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).left.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ::soplex::infinity::__tls_init();
      local_638 = (FreeConstraintPS *)0xa00000000;
      local_668 = (undefined1  [8])0x0;
      _Stack_660._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_658[0] = 0;
      local_658[1] = 0;
      stack0xfffffffffffff9b0 = 0;
      uStack_64b = 0;
      _local_648 = 0;
      uStack_643 = 0;
      local_640 = 0;
      local_63c = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)local_668,(double)local_4a8);
      if (((*(int *)((long)(pnVar6->m_backend).data._M_elems + lVar22 + -8) != 2) &&
          ((fpclass_type)local_638 != cpp_dec_float_NaN)) &&
         (iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             ((cpp_dec_float<50U,_int,_void> *)
                              ((long)pnVar6[-1].m_backend.data._M_elems + lVar22),
                              (cpp_dec_float<50U,_int,_void> *)local_668), iVar17 < 1)) {
        pnVar6 = (pSVar27->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).right.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        ::soplex::infinity::__tls_init();
        local_558 = (FreeConstraintPS *)0xa00000000;
        local_588 = (undefined1  [16])0x0;
        local_578[0] = 0;
        local_578[1] = 0;
        stack0xfffffffffffffa90 = 0;
        uStack_56b = 0;
        local_568[0] = 0;
        local_568[1] = 0;
        local_568[2] = 0;
        local_55c = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)local_588,(double)local_538);
        if (((*(int *)((long)(pnVar6->m_backend).data._M_elems + lVar22 + -8) != 2) &&
            ((fpclass_type)local_558 != cpp_dec_float_NaN)) &&
           (iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)
                                ((long)pnVar6[-1].m_backend.data._M_elems + lVar22),
                                (cpp_dec_float<50U,_int,_void> *)local_588), -1 < iVar17)) {
          local_548 = (FreeConstraintPS *)operator_new(0x88);
          local_438.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (local_628->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
          local_438.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (local_628->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
          if (local_438.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_438.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_438.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_438.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_438.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          FreeConstraintPS::FreeConstraintPS(local_548,pSVar27,iVar16 + -1,&local_438);
          local_668 = (undefined1  [8])local_548;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::FreeConstraintPS*>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_668 + 8),local_548);
          if (local_438.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_438.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          std::
          vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
          ::push_back((vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
                       *)local_488,(value_type *)local_668);
          pSVar30 = local_628;
          piVar20 = (local_628->m_rIdx).data;
          piVar20[lVar31 + -1] =
               piVar20[(long)(pSVar27->
                             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).
                             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             .set.thenum + -1];
          (*(pSVar27->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._vptr_ClassArray[0xf])(pSVar27,(ulong)(iVar16 - 1));
          piVar20 = (pSVar30->m_stat).data + 1;
          *piVar20 = *piVar20 + 1;
          if (_Stack_660._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_660._M_pi);
          }
          local_490 = (ulong)((int)local_490 + 1);
        }
      }
      lVar22 = lVar22 + -0x38;
      bVar15 = 1 < lVar31;
      lVar31 = lVar31 + -1;
    } while (bVar15);
  }
  local_620 = 0;
  local_4a8 = (FreeConstraintPS *)0x0;
  if (0 < (pSVar27->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum) {
    local_548 = (FreeConstraintPS *)((ulong)local_538 ^ 0x8000000000000000);
    uStack_540 = uStack_530 ^ 0x8000000000000000;
    uVar25 = 0;
    local_4a8 = (FreeConstraintPS *)0x0;
    local_620 = 0;
    local_60c = 0;
    do {
      pnVar6 = (pSVar27->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).low.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_5a8 = *(uint (*) [2])(pnVar6[uVar25].m_backend.data._M_elems + 8);
      local_5c8 = *(element_type **)&pnVar6[uVar25].m_backend.data;
      p_Stack_5c0 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                     (pnVar6[uVar25].m_backend.data._M_elems + 2);
      puVar2 = pnVar6[uVar25].m_backend.data._M_elems + 4;
      local_5b8 = *(uint (*) [2])puVar2;
      auStack_5b0 = *(uint (*) [2])(puVar2 + 2);
      local_5a0 = pnVar6[uVar25].m_backend.exp;
      local_59c[0] = pnVar6[uVar25].m_backend.neg;
      local_598 = *(FreeConstraintPS **)&pnVar6[uVar25].m_backend.fpclass;
      if ((int)local_598 == 2) {
LAB_002d5e45:
        pFVar32 = local_598;
        bVar15 = local_59c[0];
        iVar16 = local_5a0;
        local_338[0] = local_5a8[0];
        local_338[1] = local_5a8[1];
        local_348[0] = local_5b8[0];
        local_348[1] = local_5b8[1];
        auStack_340[0] = auStack_5b0[0];
        auStack_340[1] = auStack_5b0[1];
        local_358 = local_5c8;
        _Stack_350._M_pi = p_Stack_5c0;
        local_488 = local_598;
        uStack_480 = 0;
        epsZero((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)&local_d8,local_628);
        _local_648 = (undefined5)local_338._0_8_;
        uStack_643 = SUB83(local_338._0_8_,5);
        local_658[0] = local_348[0];
        local_658[1] = local_348[1];
        stack0xfffffffffffff9b0 = auStack_340._0_5_;
        uStack_64b = auStack_340[1]._1_3_;
        _Stack_660._M_pi = _Stack_350._M_pi;
        local_668 = (undefined1  [8])local_358;
        _Var12 = _local_668;
        local_640 = iVar16;
        local_63c = bVar15;
        local_638 = pFVar32;
        if ((bVar15 == true) &&
           (local_668._0_4_ = SUB84(local_358,0), local_668._0_4_ != 0 || (int)local_488 != 0)) {
          local_63c = false;
        }
        pSVar27 = local_630;
        _local_668 = _Var12;
        if ((((int)local_488 == 2) || (local_d8.fpclass == cpp_dec_float_NaN)) ||
           (iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)local_668,&local_d8),
           pSVar27 = local_630, 0 < iVar16)) goto LAB_002d5f83;
        local_668 = (undefined1  [8])0x0;
        _Stack_660._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        pFVar32 = (FreeConstraintPS *)0x0;
LAB_002d61b4:
        local_63c = false;
        local_640 = 0;
        uStack_643 = 0;
        _local_648 = 0;
        uStack_64b = 0;
        stack0xfffffffffffff9b0 = 0;
        local_658[0] = 0;
        local_658[1] = 0;
        local_638 = (FreeConstraintPS *)0xa00000000;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)local_668,(double)pFVar32);
        (*(pSVar27->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x2a])(pSVar27,uVar25 & 0xffffffff,local_668,0);
        local_620 = (ulong)((int)local_620 + 1);
      }
      else {
        local_638 = (FreeConstraintPS *)0xa00000000;
        local_668 = (undefined1  [8])0x0;
        _Stack_660._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_658[0] = 0;
        local_658[1] = 0;
        stack0xfffffffffffff9b0 = 0;
        uStack_64b = 0;
        _local_648 = 0;
        uStack_643 = 0;
        local_640 = 0;
        local_63c = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)local_668,0.0);
        iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           ((cpp_dec_float<50U,_int,_void> *)&local_5c8,
                            (cpp_dec_float<50U,_int,_void> *)local_668);
        if (iVar16 != 0) goto LAB_002d5e45;
LAB_002d5f83:
        ::soplex::infinity::__tls_init();
        local_638 = (FreeConstraintPS *)0xa00000000;
        local_668 = (undefined1  [8])0x0;
        _Stack_660._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_658[0] = 0;
        local_658[1] = 0;
        stack0xfffffffffffff9b0 = 0;
        uStack_64b = 0;
        _local_648 = 0;
        uStack_643 = 0;
        local_640 = 0;
        local_63c = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)local_668,(double)local_548);
        if ((((fpclass_type)local_598 != cpp_dec_float_NaN) &&
            ((fpclass_type)local_638 != cpp_dec_float_NaN)) &&
           (iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)&local_5c8,
                                (cpp_dec_float<50U,_int,_void> *)local_668), 0 < iVar16)) {
          auStack_5f0[1]._1_3_ = uStack_50b;
          auStack_5f0._0_5_ = stack0xfffffffffffffaf0;
          local_608 = local_528;
          peVar13 = local_608;
          p_Stack_600 = p_Stack_520;
          local_5e8[1]._1_3_ = uStack_503;
          local_5e8._0_5_ = _local_508;
          local_5f8[0] = local_518[0];
          local_5f8[1] = local_518[1];
          local_5e0 = local_500;
          local_5dc[0] = local_4fc;
          local_5d8[0] = local_4f8;
          local_608._0_4_ = (uint)local_528;
          if ((uint)local_608 != 0 || (int)local_4f8 != 0) {
            local_5dc[0] = (bool)(local_4fc ^ 1);
          }
          local_608 = peVar13;
          if ((((int)local_4f8 != 2) && ((fpclass_type)local_598 != cpp_dec_float_NaN)) &&
             (iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 ((cpp_dec_float<50U,_int,_void> *)&local_5c8,
                                  (cpp_dec_float<50U,_int,_void> *)&local_608), iVar16 < 0)) {
            ::soplex::infinity::__tls_init();
            _local_668 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                          )ZEXT816(0);
            pFVar32 = local_548;
            goto LAB_002d61b4;
          }
        }
        ::soplex::infinity::__tls_init();
        local_638 = (FreeConstraintPS *)0xa00000000;
        _local_668 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                      )ZEXT816(0);
        local_658[0] = 0;
        local_658[1] = 0;
        stack0xfffffffffffff9b0 = 0;
        uStack_64b = 0;
        _local_648 = 0;
        uStack_643 = 0;
        local_640 = 0;
        local_63c = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)local_668,(double)local_538);
        if ((((((fpclass_type)local_598 != cpp_dec_float_NaN) &&
              ((fpclass_type)local_638 != cpp_dec_float_NaN)) &&
             (iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 ((cpp_dec_float<50U,_int,_void> *)&local_5c8,
                                  (cpp_dec_float<50U,_int,_void> *)local_668), iVar16 < 0)) &&
            (((fpclass_type)local_598 != cpp_dec_float_NaN &&
             ((fpclass_type)local_4f8 != cpp_dec_float_NaN)))) &&
           (iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)&local_5c8,
                                (cpp_dec_float<50U,_int,_void> *)&local_528), 0 < iVar16)) {
          ::soplex::infinity::__tls_init();
          local_668 = (undefined1  [8])0x0;
          _Stack_660._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          pFVar32 = local_538;
          goto LAB_002d61b4;
        }
      }
      pnVar6 = (pSVar27->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).up.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_5e8 = *(uint (*) [2])(pnVar6[uVar25].m_backend.data._M_elems + 8);
      local_608 = *(element_type **)&pnVar6[uVar25].m_backend.data;
      p_Stack_600 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                     (pnVar6[uVar25].m_backend.data._M_elems + 2);
      puVar2 = pnVar6[uVar25].m_backend.data._M_elems + 4;
      local_5f8 = *(uint (*) [2])puVar2;
      auStack_5f0 = *(uint (*) [2])(puVar2 + 2);
      local_5e0 = pnVar6[uVar25].m_backend.exp;
      local_5dc[0] = pnVar6[uVar25].m_backend.neg;
      local_5d8[0] = *(FreeConstraintPS **)&pnVar6[uVar25].m_backend.fpclass;
      if ((int)local_5d8[0] == 2) {
LAB_002d6273:
        pFVar32 = local_5d8[0];
        bVar15 = local_5dc[0];
        iVar16 = local_5e0;
        local_368[0] = local_5e8[0];
        local_368[1] = local_5e8[1];
        local_378[0] = local_5f8[0];
        local_378[1] = local_5f8[1];
        auStack_370[0] = auStack_5f0[0];
        auStack_370[1] = auStack_5f0[1];
        local_388 = local_608;
        _Stack_380._M_pi = p_Stack_600;
        local_488 = local_5d8[0];
        uStack_480 = 0;
        epsZero((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)&local_110,local_628);
        _local_648 = (undefined5)local_368._0_8_;
        uStack_643 = SUB83(local_368._0_8_,5);
        local_658[0] = local_378[0];
        local_658[1] = local_378[1];
        stack0xfffffffffffff9b0 = auStack_370._0_5_;
        uStack_64b = auStack_370[1]._1_3_;
        _Stack_660._M_pi = _Stack_380._M_pi;
        local_668 = (undefined1  [8])local_388;
        _Var12 = _local_668;
        local_640 = iVar16;
        local_63c = bVar15;
        local_638 = pFVar32;
        if ((bVar15 == true) &&
           (local_668._0_4_ = SUB84(local_388,0), local_668._0_4_ != 0 || (int)local_488 != 0)) {
          local_63c = false;
        }
        pSVar27 = local_630;
        _local_668 = _Var12;
        if ((((int)local_488 == 2) || (local_110.fpclass == cpp_dec_float_NaN)) ||
           (iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)local_668,&local_110),
           pSVar27 = local_630, 0 < iVar16)) goto LAB_002d63a6;
        local_668 = (undefined1  [8])0x0;
        _Stack_660._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        pFVar32 = (FreeConstraintPS *)0x0;
LAB_002d65d7:
        local_63c = false;
        local_640 = 0;
        uStack_643 = 0;
        _local_648 = 0;
        uStack_64b = 0;
        stack0xfffffffffffff9b0 = 0;
        local_658[0] = 0;
        local_658[1] = 0;
        local_638 = (FreeConstraintPS *)0xa00000000;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)local_668,(double)pFVar32);
        (*(pSVar27->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x2d])(pSVar27,uVar25 & 0xffffffff,local_668,0);
        local_620 = (ulong)((int)local_620 + 1);
      }
      else {
        local_638 = (FreeConstraintPS *)0xa00000000;
        local_668 = (undefined1  [8])0x0;
        _Stack_660._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_658[0] = 0;
        local_658[1] = 0;
        stack0xfffffffffffff9b0 = 0;
        uStack_64b = 0;
        _local_648 = 0;
        uStack_643 = 0;
        local_640 = 0;
        local_63c = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)local_668,0.0);
        iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           ((cpp_dec_float<50U,_int,_void> *)&local_608,
                            (cpp_dec_float<50U,_int,_void> *)local_668);
        if (iVar16 != 0) goto LAB_002d6273;
LAB_002d63a6:
        ::soplex::infinity::__tls_init();
        local_638 = (FreeConstraintPS *)0xa00000000;
        local_668 = (undefined1  [8])0x0;
        _Stack_660._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_658[0] = 0;
        local_658[1] = 0;
        stack0xfffffffffffff9b0 = 0;
        uStack_64b = 0;
        _local_648 = 0;
        uStack_643 = 0;
        local_640 = 0;
        local_63c = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)local_668,(double)local_548);
        if ((((fpclass_type)local_5d8[0] != cpp_dec_float_NaN) &&
            ((fpclass_type)local_638 != cpp_dec_float_NaN)) &&
           (iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)&local_608,
                                (cpp_dec_float<50U,_int,_void> *)local_668), 0 < iVar16)) {
          local_588._8_8_ = p_Stack_520;
          local_588._0_8_ = local_528;
          auVar14 = local_588;
          local_568[1]._1_3_ = uStack_503;
          local_568._0_5_ = _local_508;
          local_578[0] = local_518[0];
          local_578[1] = local_518[1];
          stack0xfffffffffffffa90 = stack0xfffffffffffffaf0;
          uStack_56b = uStack_50b;
          local_568[2] = local_500;
          local_55c = local_4fc;
          local_558 = local_4f8;
          local_588._0_4_ = SUB84(local_528,0);
          if (local_588._0_4_ != 0 || (int)local_4f8 != 0) {
            local_55c = (bool)(local_4fc ^ 1);
          }
          local_588 = auVar14;
          if ((((int)local_4f8 != 2) && ((fpclass_type)local_5d8[0] != cpp_dec_float_NaN)) &&
             (iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 ((cpp_dec_float<50U,_int,_void> *)&local_608,
                                  (cpp_dec_float<50U,_int,_void> *)local_588), iVar16 < 0)) {
            ::soplex::infinity::__tls_init();
            _local_668 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                          )ZEXT816(0);
            pFVar32 = local_548;
            goto LAB_002d65d7;
          }
        }
        ::soplex::infinity::__tls_init();
        local_638 = (FreeConstraintPS *)0xa00000000;
        _local_668 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                      )ZEXT816(0);
        local_658[0] = 0;
        local_658[1] = 0;
        stack0xfffffffffffff9b0 = 0;
        uStack_64b = 0;
        _local_648 = 0;
        uStack_643 = 0;
        local_640 = 0;
        local_63c = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)local_668,(double)local_538);
        if ((((((fpclass_type)local_5d8[0] != cpp_dec_float_NaN) &&
              ((fpclass_type)local_638 != cpp_dec_float_NaN)) &&
             (iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 ((cpp_dec_float<50U,_int,_void> *)&local_608,
                                  (cpp_dec_float<50U,_int,_void> *)local_668), iVar16 < 0)) &&
            (((fpclass_type)local_5d8[0] != cpp_dec_float_NaN &&
             ((fpclass_type)local_4f8 != cpp_dec_float_NaN)))) &&
           (iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)&local_608,
                                (cpp_dec_float<50U,_int,_void> *)&local_528), 0 < iVar16)) {
          ::soplex::infinity::__tls_init();
          local_668 = (undefined1  [8])0x0;
          _Stack_660._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          pFVar32 = local_538;
          goto LAB_002d65d7;
        }
      }
      local_168[0] = local_5a8[0];
      local_168[1] = local_5a8[1];
      local_178[0] = local_5b8[0];
      local_178[1] = local_5b8[1];
      auStack_170[0] = auStack_5b0[0];
      auStack_170[1] = auStack_5b0[1];
      local_188 = local_5c8;
      p_Stack_180 = p_Stack_5c0;
      local_160 = local_5a0;
      local_15c = local_59c[0];
      local_158 = local_598;
      local_1c8 = local_608;
      p_Stack_1c0 = p_Stack_600;
      local_1b8[0] = local_5f8[0];
      local_1b8[1] = local_5f8[1];
      auStack_1b0[0] = auStack_5f0[0];
      auStack_1b0[1] = auStack_5f0[1];
      local_1a8[0] = local_5e8[0];
      local_1a8[1] = local_5e8[1];
      local_1a0 = local_5e0;
      local_19c = local_5dc[0];
      local_198 = local_5d8[0];
      this_01 = (local_628->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      this_02 = (local_628->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_02->_M_use_count = this_02->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_02->_M_use_count = this_02->_M_use_count + 1;
        }
      }
      eps = Tolerances::epsilon(this_01);
      bVar15 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                         ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&local_188,
                          (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&local_1c8,eps);
      if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
      }
      pSVar27 = local_630;
      if (bVar15) {
        if (local_59c[0] == true) {
          local_59c[0] = (uint)local_5c8 == 0 && (fpclass_type)local_598 == cpp_dec_float_finite;
        }
        if (local_5dc[0] == true) {
          local_5dc[0] = (uint)local_608 == 0 && (fpclass_type)local_5d8[0] == cpp_dec_float_finite;
        }
        if ((fpclass_type)local_5d8[0] == cpp_dec_float_NaN ||
            (fpclass_type)local_598 == cpp_dec_float_NaN) {
          bVar15 = false;
        }
        else {
          iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             ((cpp_dec_float<50U,_int,_void> *)&local_5c8,
                              (cpp_dec_float<50U,_int,_void> *)&local_608);
          bVar15 = 0 < iVar16;
        }
        pcVar26 = (cpp_dec_float<50U,_int,_void> *)&local_608;
        if (bVar15) {
          pcVar26 = (cpp_dec_float<50U,_int,_void> *)&local_5c8;
        }
        local_568._0_8_ = *(undefined8 *)((pcVar26->data)._M_elems + 8);
        local_588 = *(undefined1 (*) [16])(pcVar26->data)._M_elems;
        local_578._0_8_ = *(undefined8 *)((pcVar26->data)._M_elems + 4);
        uVar10 = *(undefined8 *)((pcVar26->data)._M_elems + 6);
        stack0xfffffffffffffa90 = (undefined5)uVar10;
        uStack_56b = (undefined3)((ulong)uVar10 >> 0x28);
        piVar20 = &local_5e0;
        if (bVar15) {
          piVar20 = &local_5a0;
        }
        local_568[2] = *piVar20;
        pbVar18 = local_5dc;
        if (bVar15) {
          pbVar18 = local_59c;
        }
        local_55c = *pbVar18;
        ppFVar19 = local_5d8;
        if (bVar15) {
          ppFVar19 = &local_598;
        }
        ppFVar11 = local_5d8;
        if (bVar15) {
          ppFVar11 = &local_598;
        }
        local_558 = (FreeConstraintPS *)
                    CONCAT44(*(undefined4 *)((long)ppFVar11 + 4),*(int *)ppFVar19);
        if (*(int *)ppFVar19 != 2) {
          local_638 = (FreeConstraintPS *)0xa00000000;
          local_668 = (undefined1  [8])0x0;
          _Stack_660._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_658[0] = 0;
          local_658[1] = 0;
          stack0xfffffffffffff9b0 = 0;
          uStack_64b = 0;
          _local_648 = 0;
          uStack_643 = 0;
          local_640 = 0;
          local_63c = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)local_668,1.0);
          iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             ((cpp_dec_float<50U,_int,_void> *)local_588,
                              (cpp_dec_float<50U,_int,_void> *)local_668);
          if (iVar16 < 0) {
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)local_588,1.0);
          }
        }
        pIVar7 = (pSVar27->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.theitem;
        iVar16 = (pSVar27->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thekey[uVar25].idx;
        if (0 < pIVar7[iVar16].data.
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .memused) {
          pIVar7 = pIVar7 + iVar16;
          uVar28 = 0;
          do {
            pNVar8 = (pIVar7->data).
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .m_elem;
            local_4c8 = *(uint (*) [2])(pNVar8[(int)uVar28].val.m_backend.data._M_elems + 8);
            local_4e8 = *(element_type **)pNVar8[(int)uVar28].val.m_backend.data._M_elems;
            _Stack_4e0._M_pi =
                 *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                  (pNVar8[(int)uVar28].val.m_backend.data._M_elems + 2);
            puVar2 = pNVar8[(int)uVar28].val.m_backend.data._M_elems + 4;
            local_4d8 = *(uint (*) [2])puVar2;
            auStack_4d0 = *(uint (*) [2])(puVar2 + 2);
            local_4c0 = pNVar8[(int)uVar28].val.m_backend.exp;
            local_4bc = pNVar8[(int)uVar28].val.m_backend.neg;
            fVar3 = pNVar8[(int)uVar28].val.m_backend.fpclass;
            iVar4 = pNVar8[(int)uVar28].val.m_backend.prec_elem;
            local_4b8 = (FreeConstraintPS *)CONCAT44(iVar4,fVar3);
            if ((local_4bc == true) && ((uint)local_4e8 != 0 || fVar3 != cpp_dec_float_finite)) {
              local_4bc = false;
            }
            local_3fc = local_4bc;
            local_3f8 = (FreeConstraintPS *)CONCAT44(iVar4,fVar3);
            local_428 = local_4e8;
            _Stack_420._M_pi = _Stack_4e0._M_pi;
            local_418 = local_4d8;
            auStack_410 = auStack_4d0;
            local_408 = local_4c8;
            local_400 = local_4c0;
            local_3e8 = local_4e8;
            p_Stack_3e0 = _Stack_4e0._M_pi;
            local_3d8 = local_4d8;
            auStack_3d0 = auStack_4d0;
            local_3c8._0_8_ = local_4c8;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                      ((cpp_dec_float<50U,_int,_void> *)&local_428,
                       (cpp_dec_float<50U,_int,_void> *)local_588);
            auStack_1f0[1]._1_3_ = uStack_45b;
            auStack_1f0._0_5_ = stack0xfffffffffffffba0;
            local_208 = (element_type *)local_478;
            p_Stack_200 = uStack_470;
            local_1f8[0] = local_468[0];
            local_1f8[1] = local_468[1];
            local_1e8[1]._1_3_ = uStack_453;
            local_1e8._0_5_ = _local_458;
            local_1e0 = local_450;
            local_1dc = local_44c;
            local_1d8 = local_448;
            _local_648 = local_408._0_5_;
            uStack_643 = local_408[1]._1_3_;
            local_658[0] = local_418[0];
            local_658[1] = local_418[1];
            stack0xfffffffffffff9b0 = auStack_410._0_5_;
            uStack_64b = auStack_410[1]._1_3_;
            _Stack_660._M_pi = _Stack_420._M_pi;
            local_668 = (undefined1  [8])local_428;
            _Var12 = _local_668;
            local_640 = local_400;
            local_63c = local_3fc;
            local_638 = local_3f8;
            if ((local_3fc == true) &&
               (local_668._0_4_ = SUB84(local_428,0), local_668._0_4_ != 0 || (int)local_3f8 != 0))
            {
              local_63c = false;
            }
            _local_668 = _Var12;
            if (((int)local_448 == 2 || (int)local_3f8 == 2) ||
               (iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   ((cpp_dec_float<50U,_int,_void> *)local_668,
                                    (cpp_dec_float<50U,_int,_void> *)&local_208), 0 < iVar16)) {
              if (((fpclass_type)local_4b8 == cpp_dec_float_NaN) ||
                 (((fpclass_type)local_4f8 == cpp_dec_float_NaN ||
                  (iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                      ((cpp_dec_float<50U,_int,_void> *)&local_4e8,
                                       (cpp_dec_float<50U,_int,_void> *)&local_528), iVar16 < 1))))
              {
                _local_648 = local_4c8._0_5_;
                uStack_643 = local_4c8[1]._1_3_;
                local_658[0] = local_4d8[0];
                local_658[1] = local_4d8[1];
                stack0xfffffffffffff9b0 = auStack_4d0._0_5_;
                uStack_64b = auStack_4d0[1]._1_3_;
                _Stack_660._M_pi = _Stack_4e0._M_pi;
                local_668 = (undefined1  [8])local_4e8;
                _Var12 = _local_668;
                auStack_270[1]._1_3_ = uStack_45b;
                auStack_270._0_5_ = stack0xfffffffffffffba0;
                local_288 = (element_type *)local_478;
                p_Stack_280 = uStack_470;
                local_278[0] = local_468[0];
                local_278[1] = local_468[1];
                local_268[1]._1_3_ = uStack_453;
                local_268._0_5_ = _local_458;
                local_260 = local_450;
                local_25c = local_44c;
                local_258 = local_448;
                local_640 = local_4c0;
                local_63c = local_4bc;
                local_638 = local_4b8;
                if ((local_4bc == true) &&
                   (local_668._0_4_ = SUB84(local_4e8,0),
                   local_668._0_4_ != 0 || (int)local_4b8 != 0)) {
                  local_63c = false;
                }
                _local_668 = _Var12;
                if (((((int)local_448 != 2 && (int)local_4b8 != 2) &&
                     (iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                               compare((cpp_dec_float<50U,_int,_void> *)local_668,
                                       (cpp_dec_float<50U,_int,_void> *)&local_288), iVar16 < 1)) &&
                    (pSVar23 = (local_628->
                               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).spxout, pSVar23 != (SPxOut *)0x0)) &&
                   (0 < (int)pSVar23->m_verbosity)) {
                  local_668._0_4_ = pSVar23->m_verbosity;
                  local_58c = 1;
                  (*pSVar23->_vptr_SPxOut[2])(pSVar23,&local_58c);
                  pSVar30 = local_628;
                  pSVar23 = (local_628->
                            super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).spxout;
                  std::__ostream_insert<char,std::char_traits<char>>
                            (pSVar23->m_streams[pSVar23->m_verbosity],
                             "WMAISM06 Warning! Tiny matrix coefficient ",0x2a);
                  local_2c8 = local_4e8;
                  p_Stack_2c0 = _Stack_4e0._M_pi;
                  local_2b8[0] = local_4d8[0];
                  local_2b8[1] = local_4d8[1];
                  auStack_2b0[0] = auStack_4d0[0];
                  auStack_2b0[1] = auStack_4d0[1];
                  local_2a8[0] = local_4c8[0];
                  local_2a8[1] = local_4c8[1];
                  local_2a0 = local_4c0;
                  local_29c = local_4bc;
                  local_298 = local_4b8;
                  os = pSVar23->m_streams[pSVar23->m_verbosity];
                  r = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)&local_2c8;
                  goto LAB_002d6e21;
                }
              }
              else {
                pSVar23 = (local_628->
                          super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).spxout;
                if ((pSVar23 != (SPxOut *)0x0) && (0 < (int)pSVar23->m_verbosity)) {
                  local_668._0_4_ = pSVar23->m_verbosity;
                  local_58c = 1;
                  (*pSVar23->_vptr_SPxOut[2])(pSVar23,&local_58c);
                  pSVar30 = local_628;
                  pSVar23 = (local_628->
                            super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).spxout;
                  std::__ostream_insert<char,std::char_traits<char>>
                            (pSVar23->m_streams[pSVar23->m_verbosity],
                             "WMAISM05 Warning! Big matrix coefficient ",0x29);
                  local_248 = local_4e8;
                  p_Stack_240 = _Stack_4e0._M_pi;
                  local_238[0] = local_4d8[0];
                  local_238[1] = local_4d8[1];
                  auStack_230[0] = auStack_4d0[0];
                  auStack_230[1] = auStack_4d0[1];
                  local_228[0] = local_4c8[0];
                  local_228[1] = local_4c8[1];
                  local_220 = local_4c0;
                  local_21c = local_4bc;
                  local_218 = local_4b8;
                  os = pSVar23->m_streams[pSVar23->m_verbosity];
                  r = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)&local_248;
LAB_002d6e21:
                  boost::multiprecision::operator<<(os,r);
                  cVar9 = (char)pSVar23->m_streams[pSVar23->m_verbosity];
                  std::ios::widen((char)*(undefined8 *)
                                         (*(long *)pSVar23->m_streams[pSVar23->m_verbosity] + -0x18)
                                  + cVar9);
                  std::ostream::put(cVar9);
                  std::ostream::flush();
                  pSVar23 = (pSVar30->
                            super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).spxout;
                  (*pSVar23->_vptr_SPxOut[2])(pSVar23,local_668);
                }
              }
              uVar28 = uVar28 + 1;
            }
            else {
              this_00 = (local_630->
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .set.theitem +
                        (local_630->
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .set.thekey
                        [(pIVar7->data).
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .m_elem[(int)uVar28].idx].idx;
              pNVar8 = (this_00->data).
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .m_elem;
              if ((pNVar8 == (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)0x0) ||
                 (pcVar21 = (char *)(long)(this_00->data).
                                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          .memused, (long)pcVar21 < 1)) {
LAB_002d6ee5:
                __filename = (char *)0xffffffff;
              }
              else {
                if (uVar25 == (uint)pNVar8->idx) {
                  bVar15 = true;
                  __filename = (char *)0x0;
                }
                else {
                  piVar20 = &pNVar8[1].idx;
                  __filename = (char *)0x0;
                  do {
                    if (pcVar21 + -1 == __filename) goto LAB_002d6ee5;
                    uVar5 = *piVar20;
                    piVar20 = piVar20 + 0xf;
                    __filename = __filename + 1;
                  } while (uVar25 != uVar5);
                  bVar15 = __filename < pcVar21;
                }
                if (!bVar15) goto LAB_002d6ee5;
              }
              if (-1 < (int)__filename) {
                SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::remove((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)this_00,__filename);
              }
              SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::remove((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)pIVar7,(char *)(ulong)uVar28);
              local_4a8 = (FreeConstraintPS *)(ulong)((int)local_4a8 + 1);
            }
          } while ((int)uVar28 <
                   (pIVar7->data).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .memused);
        }
      }
      pSVar27 = local_630;
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::obj((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *)local_588,local_630,(int)uVar25);
      if ((fpclass_type)local_558 == cpp_dec_float_NaN) {
LAB_002d6f81:
        pFVar32 = local_558;
        bVar15 = local_55c;
        uVar28 = local_568[2];
        local_398[0] = local_568[0];
        local_398[1] = local_568[1];
        uStack_3a0 = CONCAT35(uStack_56b,stack0xfffffffffffffa90);
        local_3a8[0] = local_578[0];
        local_3a8[1] = local_578[1];
        local_3b8 = (element_type *)local_588._0_8_;
        _Stack_3b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_588._8_8_;
        local_488 = local_558;
        uStack_480 = 0;
        epsZero((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)&local_148,local_628);
        _local_648 = (undefined5)local_398._0_8_;
        uStack_643 = SUB83(local_398._0_8_,5);
        local_658[0] = local_3a8[0];
        local_658[1] = local_3a8[1];
        stack0xfffffffffffff9b0 = (undefined5)uStack_3a0;
        uStack_64b = (undefined3)((ulong)uStack_3a0 >> 0x28);
        _Stack_660._M_pi = _Stack_3b0._M_pi;
        local_668 = (undefined1  [8])local_3b8;
        _Var12 = _local_668;
        local_640 = uVar28;
        local_63c = bVar15;
        local_638 = pFVar32;
        if ((bVar15 == true) &&
           (local_668._0_4_ = SUB84(local_3b8,0), local_668._0_4_ != 0 || (int)local_488 != 0)) {
          local_63c = false;
        }
        pSVar27 = local_630;
        _local_668 = _Var12;
        if ((((int)local_488 == 2) || (local_148.fpclass == cpp_dec_float_NaN)) ||
           (iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)local_668,&local_148),
           pSVar27 = local_630, 0 < iVar16)) goto LAB_002d70ba;
        local_668 = (undefined1  [8])0x0;
        _Stack_660._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        pFVar32 = (FreeConstraintPS *)0x0;
LAB_002d72f7:
        local_63c = false;
        local_640 = 0;
        uStack_643 = 0;
        _local_648 = 0;
        uStack_64b = 0;
        stack0xfffffffffffff9b0 = 0;
        local_658[0] = 0;
        local_658[1] = 0;
        local_638 = (FreeConstraintPS *)0xa00000000;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)local_668,(double)pFVar32);
        (*(pSVar27->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x24])(pSVar27,uVar25 & 0xffffffff,local_668,0);
        local_60c = local_60c + 1;
      }
      else {
        local_638 = (FreeConstraintPS *)0xa00000000;
        local_668 = (undefined1  [8])0x0;
        _Stack_660._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_658[0] = 0;
        local_658[1] = 0;
        stack0xfffffffffffff9b0 = 0;
        uStack_64b = 0;
        _local_648 = 0;
        uStack_643 = 0;
        local_640 = 0;
        local_63c = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)local_668,0.0);
        iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           ((cpp_dec_float<50U,_int,_void> *)local_588,
                            (cpp_dec_float<50U,_int,_void> *)local_668);
        if (iVar16 != 0) goto LAB_002d6f81;
LAB_002d70ba:
        ::soplex::infinity::__tls_init();
        local_638 = (FreeConstraintPS *)0xa00000000;
        local_668 = (undefined1  [8])0x0;
        _Stack_660._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_658[0] = 0;
        local_658[1] = 0;
        stack0xfffffffffffff9b0 = 0;
        uStack_64b = 0;
        _local_648 = 0;
        uStack_643 = 0;
        local_640 = 0;
        local_63c = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)local_668,(double)local_548);
        if ((((fpclass_type)local_558 != cpp_dec_float_NaN) &&
            ((fpclass_type)local_638 != cpp_dec_float_NaN)) &&
           (iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)local_588,
                                (cpp_dec_float<50U,_int,_void> *)local_668), 0 < iVar16)) {
          auStack_4d0[1]._1_3_ = uStack_50b;
          auStack_4d0._0_5_ = stack0xfffffffffffffaf0;
          local_4e8 = local_528;
          peVar13 = local_4e8;
          _Stack_4e0._M_pi = p_Stack_520;
          local_4c8[1]._1_3_ = uStack_503;
          local_4c8._0_5_ = _local_508;
          local_4d8[0] = local_518[0];
          local_4d8[1] = local_518[1];
          local_4c0 = local_500;
          local_4bc = local_4fc;
          local_4b8 = local_4f8;
          local_4e8._0_4_ = (uint)local_528;
          if ((uint)local_4e8 != 0 || (int)local_4f8 != 0) {
            local_4bc = (bool)(local_4fc ^ 1);
          }
          local_4e8 = peVar13;
          if ((((int)local_4f8 != 2) && ((fpclass_type)local_558 != cpp_dec_float_NaN)) &&
             (iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 ((cpp_dec_float<50U,_int,_void> *)local_588,
                                  (cpp_dec_float<50U,_int,_void> *)&local_4e8), iVar16 < 0)) {
            ::soplex::infinity::__tls_init();
            _local_668 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                          )ZEXT816(0);
            pFVar32 = local_548;
            goto LAB_002d72f7;
          }
        }
        ::soplex::infinity::__tls_init();
        local_638 = (FreeConstraintPS *)0xa00000000;
        _local_668 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                      )ZEXT816(0);
        local_658[0] = 0;
        local_658[1] = 0;
        stack0xfffffffffffff9b0 = 0;
        uStack_64b = 0;
        _local_648 = 0;
        uStack_643 = 0;
        local_640 = 0;
        local_63c = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)local_668,(double)local_538);
        if ((((((fpclass_type)local_558 != cpp_dec_float_NaN) &&
              ((fpclass_type)local_638 != cpp_dec_float_NaN)) &&
             (iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 ((cpp_dec_float<50U,_int,_void> *)local_588,
                                  (cpp_dec_float<50U,_int,_void> *)local_668), iVar16 < 0)) &&
            (((fpclass_type)local_558 != cpp_dec_float_NaN &&
             ((fpclass_type)local_4f8 != cpp_dec_float_NaN)))) &&
           (iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)local_588,
                                (cpp_dec_float<50U,_int,_void> *)&local_528), 0 < iVar16)) {
          ::soplex::infinity::__tls_init();
          local_668 = (undefined1  [8])0x0;
          _Stack_660._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          pFVar32 = local_538;
          goto LAB_002d72f7;
        }
      }
      uVar25 = uVar25 + 1;
    } while ((long)uVar25 <
             (long)(pSVar27->
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum);
  }
  pSVar30 = local_628;
  iVar16 = (int)local_618;
  iVar17 = (int)local_490;
  iVar24 = (int)local_620;
  iVar29 = (int)local_4a8;
  if (0 < iVar16 + iVar17 + local_60c + iVar24 + iVar29) {
    piVar20 = &(local_628->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).m_remRows;
    *piVar20 = *piVar20 + iVar17;
    piVar20 = &(local_628->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).m_remNzos;
    *piVar20 = *piVar20 + iVar29;
    piVar20 = &(local_628->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).m_chgLRhs;
    *piVar20 = *piVar20 + iVar16;
    piVar20 = &(local_628->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).m_chgBnds;
    *piVar20 = *piVar20 + iVar24;
    pSVar23 = (local_628->
              super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).spxout;
    if ((pSVar23 != (SPxOut *)0x0) && (3 < (int)pSVar23->m_verbosity)) {
      local_668._0_4_ = pSVar23->m_verbosity;
      local_5c8 = (element_type *)CONCAT44(local_5c8._4_4_,4);
      (*pSVar23->_vptr_SPxOut[2])();
      pSVar23 = (pSVar30->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar23->m_streams[pSVar23->m_verbosity],"Simplifier (extremes) removed ",0x1e);
      std::ostream::operator<<((ostream *)pSVar23->m_streams[pSVar23->m_verbosity],iVar17);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar23->m_streams[pSVar23->m_verbosity]," rows, ",7);
      std::ostream::operator<<((ostream *)pSVar23->m_streams[pSVar23->m_verbosity],iVar29);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar23->m_streams[pSVar23->m_verbosity]," non-zeros, ",0xc);
      std::ostream::operator<<((ostream *)pSVar23->m_streams[pSVar23->m_verbosity],iVar24);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar23->m_streams[pSVar23->m_verbosity]," col bounds, ",0xd);
      std::ostream::operator<<((ostream *)pSVar23->m_streams[pSVar23->m_verbosity],iVar16);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar23->m_streams[pSVar23->m_verbosity]," row bounds, ",0xd);
      std::ostream::operator<<((ostream *)pSVar23->m_streams[pSVar23->m_verbosity],local_60c);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar23->m_streams[pSVar23->m_verbosity]," objective coefficients",0x17);
      cVar9 = (char)pSVar23->m_streams[pSVar23->m_verbosity];
      std::ios::widen((char)*(undefined8 *)
                             (*(long *)pSVar23->m_streams[pSVar23->m_verbosity] + -0x18) + cVar9);
      std::ostream::put(cVar9);
      std::ostream::flush();
      pSVar23 = (pSVar30->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
      (*pSVar23->_vptr_SPxOut[2])(pSVar23,local_668);
    }
  }
  return;
}

Assistant:

void SPxMainSM<R>::handleExtremes(SPxLPBase<R>& lp)
{

   // This method handles extreme value of the given LP by
   //
   // 1. setting numbers of very small absolute values to zero and
   // 2. setting numbers of very large absolute values to R(-infinity) or +R(infinity), respectively.

   R maxVal  = R(infinity) / 5.0;
   R tol = feastol() * 1e-2;
   tol = (tol < this->epsZero()) ? this->epsZero() : tol;
   int  remRows = 0;
   int  remNzos = 0;
   int  chgBnds = 0;
   int  chgLRhs = 0;
   int  objCnt  = 0;

   for(int i = lp.nRows() - 1; i >= 0; --i)
   {
      // lhs
      R lhs = lp.lhs(i);

      if(lhs != 0.0 && isZero(lhs, this->epsZero()))
      {
         lp.changeLhs(i, R(0.0));
         ++chgLRhs;
      }
      else if(lhs > R(-infinity) && lhs < -maxVal)
      {
         lp.changeLhs(i, R(-infinity));
         ++chgLRhs;
      }
      else if(lhs <  R(infinity) && lhs >  maxVal)
      {
         lp.changeLhs(i,  R(infinity));
         ++chgLRhs;
      }

      // rhs
      R rhs = lp.rhs(i);

      if(rhs != 0.0 && isZero(rhs, this->epsZero()))
      {
         lp.changeRhs(i, R(0.0));
         ++chgLRhs;
      }
      else if(rhs > R(-infinity) && rhs < -maxVal)
      {
         lp.changeRhs(i, R(-infinity));
         ++chgLRhs;
      }
      else if(rhs <  R(infinity) && rhs >  maxVal)
      {
         lp.changeRhs(i,  R(infinity));
         ++chgLRhs;
      }

      if(lp.lhs(i) <= R(-infinity) && lp.rhs(i) >= R(infinity))
      {
         std::shared_ptr<PostStep> ptr(new FreeConstraintPS(lp, i, this->_tolerances));
         m_hist.append(ptr);

         removeRow(lp, i);
         ++remRows;

         ++m_stat[FREE_ROW];
      }
   }

   for(int j = 0; j < lp.nCols(); ++j)
   {
      // lower bound
      R lo = lp.lower(j);

      if(lo != 0.0 && isZero(lo, this->epsZero()))
      {
         lp.changeLower(j, R(0.0));
         ++chgBnds;
      }
      else if(lo > R(-infinity) && lo < -maxVal)
      {
         lp.changeLower(j, R(-infinity));
         ++chgBnds;
      }
      else if(lo <  R(infinity) && lo >  maxVal)
      {
         lp.changeLower(j,  R(infinity));
         ++chgBnds;
      }

      // upper bound
      R up = lp.upper(j);

      if(up != 0.0 && isZero(up, this->epsZero()))
      {
         lp.changeUpper(j, R(0.0));
         ++chgBnds;
      }
      else if(up > R(-infinity) && up < -maxVal)
      {
         lp.changeUpper(j, R(-infinity));
         ++chgBnds;
      }
      else if(up <  R(infinity) && up >  maxVal)
      {
         lp.changeUpper(j,  R(infinity));
         ++chgBnds;
      }

      // fixed columns will be eliminated later
      if(NE(lo, up, this->tolerances()->epsilon()))
      {
         lo = spxAbs(lo);
         up = spxAbs(up);

         R absBnd = (lo > up) ? lo : up;

         if(absBnd < 1.0)
            absBnd = 1.0;

         // non-zeros
         SVectorBase<R>& col = lp.colVector_w(j);
         int        i = 0;

         while(i < col.size())
         {
            R aij = spxAbs(col.value(i));

            if(isZero(aij * absBnd, tol))
            {
               SVectorBase<R>& row = lp.rowVector_w(col.index(i));
               int row_j = row.pos(j);

               // this changes col.size()
               if(row_j >= 0)
                  row.remove(row_j);

               col.remove(i);

               SPxOut::debug(this, "IMAISM04 aij={}  removed, absBnd={} \n", aij, absBnd);
               ++remNzos;
            }
            else
            {
               if(aij > maxVal)
               {
                  SPX_MSG_WARNING((*this->spxout),
                                  (*this->spxout) << "WMAISM05 Warning! Big matrix coefficient " << aij
                                  << std::endl);
               }
               else if(isZero(aij, tol))
               {
                  SPX_MSG_WARNING((*this->spxout),
                                  (*this->spxout) << "WMAISM06 Warning! Tiny matrix coefficient " << aij
                                  << std::endl);
               }

               ++i;
            }
         }
      }

      // objective
      R obj = lp.obj(j);

      if(obj != 0.0 && isZero(obj, this->epsZero()))
      {
         lp.changeObj(j, R(0.0));
         ++objCnt;
      }
      else if(obj > R(-infinity) && obj < -maxVal)
      {
         lp.changeObj(j, R(-infinity));
         ++objCnt;
      }
      else if(obj <  R(infinity) && obj >  maxVal)
      {
         lp.changeObj(j,  R(infinity));
         ++objCnt;
      }
   }

   if(remRows + remNzos + chgLRhs + chgBnds + objCnt > 0)
   {
      this->m_remRows += remRows;
      this->m_remNzos += remNzos;
      this->m_chgLRhs += chgLRhs;
      this->m_chgBnds += chgBnds;

      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "Simplifier (extremes) removed "
                    << remRows << " rows, "
                    << remNzos << " non-zeros, "
                    << chgBnds << " col bounds, "
                    << chgLRhs << " row bounds, "
                    << objCnt  << " objective coefficients" << std::endl;)
   }

   assert(lp.isConsistent());
}